

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall CDBIterator::GetValue<unsigned_int>(CDBIterator *this,uint *value)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key;
  size_t in_RCX;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssValue;
  uint32_t obj;
  DataStream local_40;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetValueImpl(this);
  DataStream::DataStream(&local_40,sp);
  key = dbwrapper_private::GetObfuscateKey(this->parent);
  DataStream::Xor(&local_40,key);
  DataStream::read(&local_40,(int)&local_1c,(void *)0x4,in_RCX);
  *value = local_1c;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetValue(V& value) {
        try {
            DataStream ssValue{GetValueImpl()};
            ssValue.Xor(dbwrapper_private::GetObfuscateKey(parent));
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }